

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_delsessionid(connectdata *conn,void *ssl_sessionid)

{
  curl_ssl_session *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (conn->data->set).general_ssl.max_ssl_sessions + 1;
  lVar2 = -0x88;
  do {
    lVar4 = lVar2;
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return;
    }
    pcVar1 = (conn->data->state).session;
    lVar2 = lVar4 + 0x88;
  } while (*(void **)((long)&pcVar1[1].sessionid + lVar4) != ssl_sessionid);
  Curl_ssl_kill_session((curl_ssl_session *)((long)&pcVar1[1].name + lVar4));
  return;
}

Assistant:

void Curl_ssl_delsessionid(struct connectdata *conn, void *ssl_sessionid)
{
  size_t i;
  struct Curl_easy *data = conn->data;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    struct curl_ssl_session *check = &data->state.session[i];

    if(check->sessionid == ssl_sessionid) {
      Curl_ssl_kill_session(check);
      break;
    }
  }
}